

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setStyle(QWidget *this,QStyle *style)

{
  QWidgetPrivate *this_00;
  QWExtra *pQVar1;
  long lVar2;
  QStyleSheetStyle *pQVar3;
  QStyleSheetStyle *this_01;
  bool propagate;
  QObject *object;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  setAttribute(this,WA_SetStyle,style != (QStyle *)0x0);
  QWidgetPrivate::createExtra(this_00);
  pQVar3 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(&style->super_QObject);
  if (pQVar3 != (QStyleSheetStyle *)0x0) {
    pQVar3->refcount = pQVar3->refcount + 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidgetPrivate::setStyle_helper(this_00,style,false);
      return;
    }
    goto LAB_002f4d8c;
  }
  pQVar1 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  lVar2 = (long)(pQVar1->style).wp.d;
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    object = (QObject *)0x0;
  }
  else {
    object = *(QObject **)((long)&(pQVar1->style).wp + 8);
  }
  pQVar3 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
  if (pQVar3 == (QStyleSheetStyle *)0x0) {
    QApplication::styleSheet((QString *)&local_40,QCoreApplication::self);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (local_40.size != 0) goto LAB_002f4d42;
    propagate = false;
  }
  else {
LAB_002f4d42:
    this_01 = (QStyleSheetStyle *)operator_new(0x60);
    QStyleSheetStyle::QStyleSheetStyle(this_01,style);
    propagate = true;
    style = (QStyle *)this_01;
  }
  QWidgetPrivate::setStyle_helper(this_00,style,propagate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002f4d8c:
  __stack_chk_fail();
}

Assistant:

void QWidget::setStyle(QStyle *style)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_SetStyle, style != nullptr);
    d->createExtra();
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle *styleSheetStyle = qt_styleSheet(style)) {
        //if for some reason someone try to set a QStyleSheetStyle, ref it
        //(this may happen for example in QButtonDialogBox which propagates its style)
        styleSheetStyle->ref();
        d->setStyle_helper(style, false);
    } else if (qt_styleSheet(d->extra->style) || !qApp->styleSheet().isEmpty()) {
        // if we have an application stylesheet or have a proxy already, propagate
        d->setStyle_helper(new QStyleSheetStyle(style), true);
    } else
#endif
        d->setStyle_helper(style, false);
}